

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O0

FArchive * operator<<(FArchive *arc,FDoorAnimation **Doorani)

{
  bool bVar1;
  FDoorAnimation *pFVar2;
  FTextureID local_1c;
  FDoorAnimation **ppFStack_18;
  FTextureID tex;
  FDoorAnimation **Doorani_local;
  FArchive *arc_local;
  
  ppFStack_18 = Doorani;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    operator<<(arc,&(*ppFStack_18)->BaseTexture);
  }
  else {
    FTextureID::FTextureID(&local_1c);
    operator<<(arc,&local_1c);
    pFVar2 = FTextureManager::FindAnimatedDoor(&TexMan,local_1c);
    *ppFStack_18 = pFVar2;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FDoorAnimation* &Doorani)
{
	if (arc.IsStoring())
	{
		arc << Doorani->BaseTexture;
	}
	else
	{
		FTextureID tex;
		arc << tex;
		Doorani = TexMan.FindAnimatedDoor(tex);
	}
	return arc;
}